

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O3

void __thiscall Fl_Widget_Type::write_properties(Fl_Widget_Type *this)

{
  float *pfVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar5;
  Fl_Image *pFVar4;
  Fl_Type *pFVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Fl_Widget *pFVar9;
  ulong uVar10;
  char *pcVar11;
  long lVar12;
  int n;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Fl_Color c;
  int s;
  Fl_Color fc;
  int fs;
  Fl_Font ff;
  Fl_Font f;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  
  Fl_Type::write_properties(&this->super_Fl_Type);
  write_indent((this->super_Fl_Type).level + 1);
  if (this->public_ == 0) {
    pcVar11 = "private";
LAB_00188b6c:
    write_string(pcVar11);
  }
  else if (this->public_ == 2) {
    pcVar11 = "protected";
    goto LAB_00188b6c;
  }
  if ((this->tooltip_ != (char *)0x0) && (*this->tooltip_ != '\0')) {
    write_string("tooltip");
    write_word(this->tooltip_);
  }
  if ((this->image_name_ != (char *)0x0) && (*this->image_name_ != '\0')) {
    write_string("image");
    write_word(this->image_name_);
  }
  if ((this->inactive_name_ != (char *)0x0) && (*this->inactive_name_ != '\0')) {
    write_string("deimage");
    write_word(this->inactive_name_);
  }
  pFVar9 = this->o;
  write_string("xywh {%d %d %d %d}",(ulong)(uint)pFVar9->x_,(ulong)(uint)pFVar9->y_,
               (ulong)(uint)pFVar9->w_,(ulong)(uint)pFVar9->h_);
  pFVar6 = (this->super_Fl_Type).factory[1].prev;
  iVar7 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1d])(this);
  if ((((iVar7 != 0) &&
       (lVar12 = 0x134, *(char *)((long)&this->o[2].label_.deimage + 4) != pFVar6[2].rtti)) ||
      (lVar12 = 0x6c, this->o->type_ != (uchar)pFVar6->header_position)) ||
     (iVar7 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x21])(this), iVar7 != 0)) {
    write_string("type");
    iVar7 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x2c])(this);
    pcVar11 = item_name((Fl_Menu_Item *)CONCAT44(extraout_var,iVar7),
                        (uint)*(byte *)((long)&this->o->_vptr_Fl_Widget + lVar12));
    write_word(pcVar11);
  }
  if (this->o->box_ != *(uchar *)((long)&pFVar6->header_position + 2)) {
    pcVar11 = (char *)0x0;
    write_string("box");
    uVar10 = (ulong)this->o->box_;
    uVar13 = 1000;
    if (uVar10 != 0) {
      uVar13 = uVar10;
    }
    lVar12 = 0x18;
    do {
      if (uVar13 == *(ulong *)((long)&boxmenu[0].text + lVar12)) {
        pcVar11 = *(char **)(item_name::buffer + lVar12 + 8);
        break;
      }
      lVar12 = lVar12 + 0x38;
    } while (lVar12 != 0xd70);
    write_word(pcVar11);
  }
  iVar7 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x19])(this);
  if ((iVar7 != 0) && (*(int *)((long)&this->o[1].label_.value + 4) != 0)) {
    write_string("shortcut 0x%x");
  }
  iVar7 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1a])(this);
  if ((iVar7 != 0) && (this->o[2].color_ != 0)) {
    write_string("shortcut 0x%x");
  }
  iVar7 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1b])(this);
  if ((iVar7 != 0) && (this->o[3].w_ != 0)) {
    write_string("shortcut 0x%x");
  }
  iVar7 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x18])(this);
  if (iVar7 == 0) {
    iVar7 = (*(this->super_Fl_Type)._vptr_Fl_Type[5])(this);
    iVar7 = strcmp((char *)CONCAT44(extraout_var_00,iVar7),"Fl_Input_Choice");
    if (iVar7 == 0) {
      pFVar9 = this->o;
      if (pFVar9[1].label_.value[0x89] != '\0') {
        pcVar11 = (char *)0x0;
        write_string("down_box");
        uVar10 = (ulong)(byte)pFVar9[1].label_.value[0x89];
        uVar13 = 1000;
        if (uVar10 != 0) {
          uVar13 = uVar10;
        }
        lVar12 = 0x18;
        do {
          if (uVar13 == *(ulong *)((long)&boxmenu[0].text + lVar12)) goto LAB_00188f40;
          lVar12 = lVar12 + 0x38;
        } while (lVar12 != 0xd70);
        goto LAB_00188f45;
      }
    }
    else {
      iVar7 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1f])(this);
      if ((iVar7 != 0) && (pFVar9 = this->o, *(char *)((long)&pFVar9[1].callback_ + 1) != '\0')) {
        pcVar11 = (char *)0x0;
        write_string("down_box");
        uVar10 = (ulong)*(byte *)((long)&pFVar9[1].callback_ + 1);
        uVar13 = 1000;
        if (uVar10 != 0) {
          uVar13 = uVar10;
        }
        lVar12 = 0x18;
        do {
          if (uVar13 == *(ulong *)((long)&boxmenu[0].text + lVar12)) goto LAB_00188f40;
          lVar12 = lVar12 + 0x38;
        } while (lVar12 != 0xd70);
LAB_00188f45:
        write_word(pcVar11);
      }
    }
  }
  else {
    pFVar9 = this->o;
    if (*(char *)((long)&pFVar9[1]._vptr_Fl_Widget + 6) != '\0') {
      pcVar11 = (char *)0x0;
      write_string("down_box");
      uVar10 = (ulong)*(byte *)((long)&pFVar9[1]._vptr_Fl_Widget + 6);
      uVar13 = 1000;
      if (uVar10 != 0) {
        uVar13 = uVar10;
      }
      lVar12 = 0x18;
      do {
        if (uVar13 == *(ulong *)((long)&boxmenu[0].text + lVar12)) {
          pcVar11 = *(char **)(item_name::buffer + lVar12 + 8);
          break;
        }
        lVar12 = lVar12 + 0x38;
      } while (lVar12 != 0xd70);
      write_word(pcVar11);
    }
    if (*(int *)&pFVar9[1]._vptr_Fl_Widget != 0) {
      write_string("shortcut 0x%x");
    }
    if (*(char *)((long)&pFVar9[1]._vptr_Fl_Widget + 4) != '\0') {
      write_string("value 1");
    }
  }
  pFVar9 = this->o;
  if (pFVar9->color_ != *(Fl_Color *)((long)&pFVar6->factory + 4)) {
    write_string("color %d");
    pFVar9 = this->o;
  }
  if (pFVar9->color2_ != pFVar6->code_position) {
    write_string("selection_color %d");
    pFVar9 = this->o;
  }
  if ((pFVar9->label_).type != *(uchar *)&pFVar6->prev) {
    write_string("labeltype");
    pcVar11 = item_name(labeltypemenu,(uint)(this->o->label_).type);
    write_word(pcVar11);
    pFVar9 = this->o;
  }
  if ((pFVar9->label_).font != pFVar6->level) {
    write_string("labelfont %d");
    pFVar9 = this->o;
  }
  if ((pFVar9->label_).size != *(int *)&pFVar6->field_0x4c) {
    write_string("labelsize %d");
    pFVar9 = this->o;
  }
  if ((pFVar9->label_).color != *(Fl_Color *)&pFVar6->next) {
    write_string("labelcolor %d");
    pFVar9 = this->o;
  }
  if ((pFVar9->label_).align_ != *(Fl_Align *)((long)&pFVar6->next + 4)) {
    write_string("align %d");
    pFVar9 = this->o;
  }
  if (pFVar9->when_ != *(uchar *)((long)&pFVar6->header_position + 3)) {
    write_string("when %d");
  }
  iVar7 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1c])(this);
  if (iVar7 != 0) {
    pFVar9 = this->o;
    if (((double)pFVar9[1].callback_ != (double)pFVar6[1].label_) ||
       (NAN((double)pFVar9[1].callback_) || NAN((double)pFVar6[1].label_))) {
      write_string("minimum %g");
    }
    if (((double)pFVar9[1].user_data_ != (double)pFVar6[1].callback_) ||
       (NAN((double)pFVar9[1].user_data_) || NAN((double)pFVar6[1].callback_))) {
      write_string("maximum %g");
    }
    uVar3 = pFVar9[1].x_;
    uVar5 = pFVar9[1].y_;
    auVar14._4_4_ = uVar5;
    auVar14._0_4_ = uVar3;
    auVar14._8_8_ = pFVar6[1].user_data_;
    auVar15._8_4_ = SUB84((double)*(int *)&pFVar6[1].user_data_type_,0);
    auVar15._0_8_ = (double)pFVar9[1].w_;
    auVar15._12_4_ = (int)((ulong)(double)*(int *)&pFVar6[1].user_data_type_ >> 0x20);
    auVar15 = divpd(auVar14,auVar15);
    if ((auVar15._0_8_ != auVar15._8_8_) || (NAN(auVar15._0_8_) || NAN(auVar15._8_8_))) {
      write_string("step %g");
    }
    if (((double)pFVar9[1]._vptr_Fl_Widget != 0.0) || (NAN((double)pFVar9[1]._vptr_Fl_Widget))) {
      write_string("value %g");
    }
    iVar7 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1c])(this);
    if (1 < iVar7) {
      fVar2 = (float)pFVar9[1].h_;
      pfVar1 = (float *)((long)&pFVar6[1].user_data_type_ + 4);
      if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
        write_string("slider_size %g",(double)fVar2);
      }
    }
  }
  iVar7 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1d])(this);
  if (iVar7 != 0) {
    pFVar9 = this->o;
    pcVar11 = pFVar9[1].label_.value;
    if (((double)pcVar11 != (double)pFVar6[1].comment_) ||
       (NAN((double)pcVar11) || NAN((double)pFVar6[1].comment_))) {
      write_string("minimum %g");
    }
    pFVar4 = pFVar9[1].label_.image;
    if (((double)pFVar4 != (double)pFVar6[1].parent) ||
       (NAN((double)pFVar4) || NAN((double)pFVar6[1].parent))) {
      write_string("maximum %g");
    }
    pFVar4 = pFVar9[1].label_.deimage;
    if (((double)pFVar4 != *(double *)&pFVar6[1].new_selected) ||
       (NAN((double)pFVar4) || NAN(*(double *)&pFVar6[1].new_selected))) {
      write_string("step %g");
    }
    if ((*(double *)&pFVar9[1].w_ != 1.0) || (NAN(*(double *)&pFVar9[1].w_))) {
      write_string("value %g");
    }
  }
  iVar7 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x2b])(this,4,&local_28,&local_2c,&local_30);
  if (iVar7 != 0) {
    (*(this->super_Fl_Type)._vptr_Fl_Type[0x2b])(this,0,&local_24,&local_34,&local_38);
    if (local_24 != local_28) {
      write_string("textfont %d");
    }
    if (local_34 != local_2c) {
      write_string("textsize %d");
    }
    if (local_38 != local_30) {
      write_string("textcolor %d");
    }
  }
  uVar8 = this->o->flags_;
  if ((uVar8 & 2) != 0) {
    write_string("hide");
    uVar8 = this->o->flags_;
  }
  if ((uVar8 & 1) != 0) {
    write_string("deactivate");
  }
  iVar7 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x21])(this);
  pFVar9 = this->o;
  if (iVar7 == 0) {
    if ((pFVar9->parent_ == (Fl_Group *)0x0) || (pFVar9->parent_->resizable_ != pFVar9))
    goto LAB_00189312;
  }
  else if (pFVar9[1].callback_ == (Fl_Callback *)0x0) goto LAB_00189312;
  write_string("resizable");
LAB_00189312:
  if (this->hotspot_ != '\0') {
    iVar7 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1e])(this);
    pcVar11 = "divider";
    if (iVar7 == 0) {
      pcVar11 = "hotspot";
    }
    write_string(pcVar11);
  }
  uVar13 = 0;
  do {
    if (this->extra_code_[uVar13] != (char *)0x0) {
      write_indent((this->super_Fl_Type).level + 1);
      write_string("code%d",uVar13 & 0xffffffff);
      write_word(this->extra_code_[uVar13]);
    }
    uVar13 = uVar13 + 1;
  } while (uVar13 != 4);
  if (this->subclass_ != (char *)0x0) {
    write_indent((this->super_Fl_Type).level + 1);
    write_string("class");
    write_word(this->subclass_);
  }
  return;
LAB_00188f40:
  pcVar11 = *(char **)(item_name::buffer + lVar12 + 8);
  goto LAB_00188f45;
}

Assistant:

void Fl_Widget_Type::write_properties() {
  Fl_Type::write_properties();
  write_indent(level+1);
  switch (public_) {
    case 0: write_string("private"); break;
    case 1: break;
    case 2: write_string("protected"); break;
  }
  if (tooltip() && *tooltip()) {
    write_string("tooltip");
    write_word(tooltip());
  }
  if (image_name() && *image_name()) {
    write_string("image");
    write_word(image_name());
  }
  if (inactive_name() && *inactive_name()) {
    write_string("deimage");
    write_word(inactive_name());
  }
  write_string("xywh {%d %d %d %d}", o->x(), o->y(), o->w(), o->h());
  Fl_Widget* tplate = ((Fl_Widget_Type*)factory)->o;
  if (is_spinner() && ((Fl_Spinner*)o)->type() != ((Fl_Spinner*)tplate)->type()) {
    write_string("type");
    write_word(item_name(subtypes(), ((Fl_Spinner*)o)->type()));
  } else if (o->type() != tplate->type() || is_window()) {
    write_string("type");
    write_word(item_name(subtypes(), o->type()));
  }
  if (o->box() != tplate->box()) {
    write_string("box"); write_word(boxname(o->box()));}
  if (is_input()) {
    Fl_Input_* b = (Fl_Input_*)o;
    if (b->shortcut()) write_string("shortcut 0x%x", b->shortcut());
  }
  if (is_value_input()) {
    Fl_Value_Input* b = (Fl_Value_Input*)o;
    if (b->shortcut()) write_string("shortcut 0x%x", b->shortcut());
  }
  if (is_text_display()) {
    Fl_Text_Display* b = (Fl_Text_Display*)o;
    if (b->shortcut()) write_string("shortcut 0x%x", b->shortcut());
  }
  if (is_button()) {
    Fl_Button* b = (Fl_Button*)o;
    if (b->down_box()) {
      write_string("down_box"); write_word(boxname(b->down_box()));}
    if (b->shortcut()) write_string("shortcut 0x%x", b->shortcut());
    if (b->value()) write_string("value 1");
  } else if (!strcmp(type_name(), "Fl_Input_Choice")) {
    Fl_Input_Choice* b = (Fl_Input_Choice*)o;
    if (b->down_box()) {
      write_string("down_box"); write_word(boxname(b->down_box()));}
  } else if (is_menu_button()) {
    Fl_Menu_* b = (Fl_Menu_*)o;
    if (b->down_box()) {
      write_string("down_box"); write_word(boxname(b->down_box()));}
  }
  if (o->color()!=tplate->color())
    write_string("color %d", o->color());
  if (o->selection_color()!=tplate->selection_color())
    write_string("selection_color %d", o->selection_color());
  if (o->labeltype()!=tplate->labeltype()) {
    write_string("labeltype");
    write_word(item_name(labeltypemenu, o->labeltype()));
  }
  if (o->labelfont()!=tplate->labelfont())
    write_string("labelfont %d", o->labelfont());
  if (o->labelsize()!=tplate->labelsize())
    write_string("labelsize %d", o->labelsize());
  if (o->labelcolor()!=tplate->labelcolor())
    write_string("labelcolor %d", o->labelcolor());
  if (o->align()!=tplate->align())
    write_string("align %d", o->align());
  if (o->when() != tplate->when())
    write_string("when %d", o->when());
  if (is_valuator()) {
    Fl_Valuator* v = (Fl_Valuator*)o;
    Fl_Valuator* f = (Fl_Valuator*)(tplate);
    if (v->minimum()!=f->minimum()) write_string("minimum %g",v->minimum());
    if (v->maximum()!=f->maximum()) write_string("maximum %g",v->maximum());
    if (v->step()!=f->step()) write_string("step %g",v->step());
    if (v->value()!=0.0) write_string("value %g",v->value());
    if (is_valuator()>=2) {
      double x = ((Fl_Slider*)v)->slider_size();
      double y = ((Fl_Slider*)f)->slider_size();
      if (x != y) write_string("slider_size %g", x);
    }
  }
  if (is_spinner()) {
    Fl_Spinner* v = (Fl_Spinner*)o;
    Fl_Spinner* f = (Fl_Spinner*)(tplate);
    if (v->minimum()!=f->minimum()) write_string("minimum %g",v->minimum());
    if (v->maximum()!=f->maximum()) write_string("maximum %g",v->maximum());
    if (v->step()!=f->step()) write_string("step %g",v->step());
    if (v->value()!=1.0) write_string("value %g",v->value());
  }
  {Fl_Font ff; int fs; Fl_Color fc; if (textstuff(4,ff,fs,fc)) {
    Fl_Font f; int s; Fl_Color c; textstuff(0,f,s,c);
    if (f != ff) write_string("textfont %d", f);
    if (s != fs) write_string("textsize %d", s);
    if (c != fc) write_string("textcolor %d", c);
  }}
  if (!o->visible()) write_string("hide");
  if (!o->active()) write_string("deactivate");
  if (resizable()) write_string("resizable");
  if (hotspot()) write_string(is_menu_item() ? "divider" : "hotspot");
  for (int n=0; n < NUM_EXTRA_CODE; n++) if (extra_code(n)) {
    write_indent(level+1);
    write_string("code%d",n);
    write_word(extra_code(n));
  }
  if (subclass()) {
    write_indent(level+1);
    write_string("class");
    write_word(subclass());
  }
}